

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdParseMemoryOperand3264(INSTRUX *Instrux,ND_OPERAND *Operand,ND_REG_SIZE VsibRegSize)

{
  ND_UINT8 NVar1;
  bool bVar2;
  ulong local_30;
  ND_UINT8 defsize;
  ND_REG_SIZE VsibRegSize_local;
  ND_OPERAND *Operand_local;
  INSTRUX *Instrux_local;
  
  NVar1 = '\b';
  if ((*(uint *)Instrux >> 6 & 3) == 1) {
    NVar1 = '\x04';
  }
  *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 0xf8 | 3;
  if ((*(uint *)&Instrux->field_0x5 >> 0xc & 1) == 0) {
    if (((Instrux->ModRm).ModRm >> 6 == 0) && (((Instrux->ModRm).ModRm & 7) == 5)) {
      bVar2 = ((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2;
      *(ushort *)&Instrux->field_0x9 =
           *(ushort *)&Instrux->field_0x9 & 0xefff | (ushort)bVar2 << 0xc;
      *(ushort *)&Operand->Info = *(ushort *)&Operand->Info & 0xffbf | (ushort)bVar2 << 6;
      if (((*(ushort *)&Operand->Info >> 6 & 1) != 0) && ((Instrux->Attributes & 0x2000000) != 0)) {
        return 0x8000000e;
      }
    }
    else {
      *(ushort *)&Operand->Info = *(ushort *)&Operand->Info & 0xfffd | 2;
      (Operand->Info).Memory.BaseSize = NVar1;
      *(byte *)((long)&Operand->Info + 10) =
           *(byte *)((long)&Operand->Info + 10) & 7 |
           ((byte)(((uint)Instrux->Exs >> 3 & 1) << 3) | (Instrux->ModRm).ModRm & 7) << 3;
      if (((uint)Instrux->Exs >> 6 & 1) != 0) {
        if ((Instrux->FeatMode & 0x10) == 0) {
          return 0x80000005;
        }
        *(byte *)((long)&Operand->Info + 10) =
             *(byte *)((long)&Operand->Info + 10) & 7 |
             (*(byte *)((long)&Operand->Info + 10) >> 3 | (byte)(((uint)Instrux->Exs >> 6 & 1) << 4)
             ) << 3;
      }
      if ((*(byte *)((long)&Operand->Info + 10) >> 3 == 4) ||
         (*(byte *)((long)&Operand->Info + 10) >> 3 == 5)) {
        *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 0xf8 | 2;
      }
    }
  }
  else {
    if (((Instrux->ModRm).ModRm >> 6 != 0) || (((Instrux->Sib).Sib & 7) != 5)) {
      *(ushort *)&Operand->Info = *(ushort *)&Operand->Info & 0xfffd | 2;
      (Operand->Info).Memory.BaseSize = NVar1;
      *(byte *)((long)&Operand->Info + 10) =
           *(byte *)((long)&Operand->Info + 10) & 7 |
           ((byte)(((uint)Instrux->Exs >> 3 & 1) << 3) | (Instrux->Sib).Sib & 7) << 3;
      if (((uint)Instrux->Exs >> 6 & 1) != 0) {
        if ((Instrux->FeatMode & 0x10) == 0) {
          return 0x80000005;
        }
        *(byte *)((long)&Operand->Info + 10) =
             *(byte *)((long)&Operand->Info + 10) & 7 |
             (*(byte *)((long)&Operand->Info + 10) >> 3 | (byte)(((uint)Instrux->Exs >> 6 & 1) << 4)
             ) << 3;
      }
      if ((*(byte *)((long)&Operand->Info + 10) >> 3 == 4) ||
         (*(byte *)((long)&Operand->Info + 10) >> 3 == 5)) {
        *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 0xf8 | 2;
      }
    }
    if ((Instrux->Attributes & 0x80) == 0) {
      (Operand->Info).Memory.Index =
           (byte)(((uint)Instrux->Exs >> 2 & 1) << 3) | (Instrux->Sib).Sib >> 3 & 7;
      if (((uint)Instrux->Exs >> 5 & 1) != 0) {
        if ((Instrux->FeatMode & 0x10) == 0) {
          return 0x80000005;
        }
        (Operand->Info).Memory.Index =
             (Operand->Info).Memory.Index | (byte)(((uint)Instrux->Exs >> 5 & 1) << 4);
      }
      if ((Operand->Info).Memory.Index != '\x04') {
        *(ushort *)&Operand->Info = *(ushort *)&Operand->Info & 0xfffb | 4;
        (Operand->Info).Memory.IndexSize = NVar1;
        (Operand->Info).Register.Count =
             (Operand->Info).Register.Count & 0xf0 | (byte)(1 << ((Instrux->Sib).Sib >> 6)) & 0xf;
      }
    }
    else {
      *(ushort *)&Operand->Info = *(ushort *)&Operand->Info & 0xfffb | 4;
      (Operand->Info).Memory.IndexSize = NVar1;
      (Operand->Info).Memory.Index =
           (byte)(((uint)Instrux->Exs >> 0x14 & 1) << 4) |
           (byte)(((uint)Instrux->Exs >> 2 & 1) << 3) | (Instrux->Sib).Sib >> 3 & 7;
      (Operand->Info).Memory.IndexSize = (ND_UINT8)VsibRegSize;
      (Operand->Info).Register.Count =
           (Operand->Info).Register.Count & 0xf0 | (byte)(1 << ((Instrux->Sib).Sib >> 6)) & 0xf;
    }
  }
  *(ushort *)&Operand->Info =
       *(ushort *)&Operand->Info & 0xfff7 |
       (ushort)((byte)(*(uint *)&Instrux->field_0x5 >> 0xd) & 1) << 3;
  (Operand->Info).Memory.DispSize = (byte)((ulong)*(undefined8 *)&Instrux->field_0xc >> 0x10) & 0xf;
  if ((*(uint *)&Instrux->field_0x5 >> 0xd & 1) == 0) {
    local_30 = 0;
  }
  else {
    local_30 = (ulong)(Instrux->field_74).Displacement &
               0xffffffffffffffffU >>
               (('\b' - ((byte)((ulong)*(undefined8 *)&Instrux->field_0xc >> 0x10) & 0xf)) * '\b' &
               0x3f) | (0xffffffffffffffffU >>
                        (('\b' - ((byte)((ulong)*(undefined8 *)&Instrux->field_0xc >> 0x10) & 0xf))
                         * '\b' & 0x3f) ^ 0xffffffffffffffff) *
                       (ulong)((Instrux->field_74).Displacement >>
                               (((byte)((ulong)*(undefined8 *)&Instrux->field_0xc >> 0x10) & 0xf) *
                                '\b' - 1 & 0x1f) & 1);
  }
  (Operand->Info).Memory.Disp = local_30;
  return 0;
}

Assistant:

static NDSTATUS
NdParseMemoryOperand3264(
    INSTRUX *Instrux,
    ND_OPERAND *Operand,
    ND_REG_SIZE VsibRegSize
    )
{
    ND_UINT8 defsize = (Instrux->AddrMode == ND_ADDR_32 ? ND_SIZE_32BIT : ND_SIZE_64BIT);

    // Implicit segment is DS.
    Operand->Info.Memory.Seg = NDR_DS;

    if (Instrux->HasSib)
    {
        // Check for base.
        if ((Instrux->ModRm.mod == 0) && (Instrux->Sib.base == NDR_RBP))
        {
            // Mod is mem without displacement and base reg is RBP -> no base reg used.
            // Note that this addressing mode is not RIP relative.
        }
        else
        {
            Operand->Info.Memory.HasBase = ND_TRUE;
            Operand->Info.Memory.BaseSize = defsize;
            Operand->Info.Memory.Base = (ND_UINT8)(Instrux->Exs.b << 3) | Instrux->Sib.base;

            if (Instrux->Exs.b4 != 0)
            {
                // If APX is present, extend the base.
                if (Instrux->FeatMode & ND_FEAT_APX)
                {
                    Operand->Info.Memory.Base |= Instrux->Exs.b4 << 4;
                }
                else
                {
                    return ND_STATUS_INVALID_REGISTER_IN_INSTRUCTION;
                }
            }

            if ((Operand->Info.Memory.Base == NDR_RSP) || (Operand->Info.Memory.Base == NDR_RBP))
            {
                Operand->Info.Memory.Seg = NDR_SS;
            }
        }

        // Check for index.
        if (ND_HAS_VSIB(Instrux))
        {
            // With VSIB, the index reg can be 4 (RSP equivalent). Bit 4 of the 32-bit index register is given by the
            // EVEX.V' field.
            Operand->Info.Memory.HasIndex = ND_TRUE;
            Operand->Info.Memory.IndexSize = defsize;
            Operand->Info.Memory.Index = (ND_UINT8)((Instrux->Exs.vp << 4) | (Instrux->Exs.x << 3) | Instrux->Sib.index);
            Operand->Info.Memory.IndexSize = (ND_UINT8)VsibRegSize;
            Operand->Info.Memory.Scale = 1 << Instrux->Sib.scale;
        }
        else
        {
            // Regular SIB, index RSP is ignored. Bit 4 of the 32-bit index register is given by the X4 field.
            Operand->Info.Memory.Index = (ND_UINT8)(Instrux->Exs.x << 3) | Instrux->Sib.index;

            if (Instrux->Exs.x4 != 0)
            {
                // If APX is present, extend the index.
                if (Instrux->FeatMode & ND_FEAT_APX)
                {
                    Operand->Info.Memory.Index |= Instrux->Exs.x4 << 4;
                }
                else
                {
                    return ND_STATUS_INVALID_REGISTER_IN_INSTRUCTION;
                }
            }

            if (Operand->Info.Memory.Index != NDR_RSP)
            {
                // Index * Scale is present.
                Operand->Info.Memory.HasIndex = ND_TRUE;
                Operand->Info.Memory.IndexSize = defsize;
                Operand->Info.Memory.Scale = 1 << Instrux->Sib.scale;
            }
        }
    }
    else
    {
        if ((Instrux->ModRm.mod == 0) && (Instrux->ModRm.rm == NDR_RBP))
        {
            //
            // RIP relative addressing addresses a memory region relative to the current RIP; However,
            // the current RIP, when executing the current instruction, is already updated and points
            // to the next instruction, therefore, we must add the instruction length also to the final
            // address. Note that RIP relative addressing is used even if the instruction uses 32 bit
            // addressing, as long as we're in long mode.
            //
            Operand->Info.Memory.IsRipRel = Instrux->IsRipRelative = (Instrux->DefCode == ND_CODE_64);

            // Some instructions (example: MPX) don't support RIP relative addressing.
            if (Operand->Info.Memory.IsRipRel && !!(Instrux->Attributes & ND_FLAG_NO_RIP_REL))
            {
                return ND_STATUS_RIP_REL_ADDRESSING_NOT_SUPPORTED;
            }
        }
        else
        {
            Operand->Info.Memory.HasBase = ND_TRUE;
            Operand->Info.Memory.BaseSize = defsize;
            Operand->Info.Memory.Base = (ND_UINT8)(Instrux->Exs.b << 3) | Instrux->ModRm.rm;

            if (Instrux->Exs.b4 != 0)
            {
                // If APX is present, extend the base register.
                if (Instrux->FeatMode & ND_FEAT_APX)
                {
                    Operand->Info.Memory.Base |= Instrux->Exs.b4 << 4;
                }
                else
                {
                    return ND_STATUS_INVALID_REGISTER_IN_INSTRUCTION;
                }
            }

            if ((Operand->Info.Memory.Base == NDR_RSP) || (Operand->Info.Memory.Base == NDR_RBP))
            {
                Operand->Info.Memory.Seg = NDR_SS;
            }
        }
    }

    Operand->Info.Memory.HasDisp = Instrux->HasDisp;
    Operand->Info.Memory.DispSize = Instrux->DispLength;
    Operand->Info.Memory.Disp = Instrux->HasDisp ? ND_SIGN_EX(Instrux->DispLength, Instrux->Displacement) : 0;

    return ND_STATUS_SUCCESS;
}